

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> * __thiscall
HighsSymmetryDetection::dumpCurrentGraph
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *__return_storage_ptr__,
          HighsSymmetryDetection *this)

{
  pointer ppVar1;
  undefined8 in_RAX;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  HighsInt colCell;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::HighsHashTable(__return_storage_ptr__);
  lVar3 = 0;
  while (lVar3 < this->numCol) {
    uStack_38 = CONCAT44((this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3],(undefined4)uStack_38);
    uVar4 = (ulong)(this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3];
    lVar5 = uVar4 * 8 + 4;
    while( true ) {
      iVar2 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if ((int)uVar4 == iVar2) break;
      ppVar1 = (this->Gedge).
               super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__,
                 (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *(int *)((long)ppVar1 + lVar5 + -4),
                 (int *)((long)&uStack_38 + 4),(uint *)((long)&ppVar1->first + lVar5));
      lVar5 = lVar5 + 8;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    lVar3 = lVar3 + 1;
    lVar5 = (long)iVar2 << 3;
    for (; iVar2 != (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3]; iVar2 = iVar2 + 1) {
      ppVar1 = (this->Gedge).
               super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__,
                 (int *)((long)&ppVar1->first + lVar5),(int *)((long)&uStack_38 + 4),
                 (uint *)((long)&ppVar1->second + lVar5));
      lVar5 = lVar5 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>
HighsSymmetryDetection::dumpCurrentGraph() {
  HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>> graphTriplets;

  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];
    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      graphTriplets.insert(vertexToCell[Gedge[j].first], colCell,
                           Gedge[j].second);
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      graphTriplets.insert(Gedge[j].first, colCell, Gedge[j].second);
  }

  return graphTriplets;
}